

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_copy(lua_State *L)

{
  TValue *pTVar1;
  uint uVar2;
  void *__dest;
  void *__src;
  
  __dest = ffi_checkptr(L,1,0x11);
  __src = ffi_checkptr(L,2,0x12);
  pTVar1 = L->base;
  if ((*(int *)((long)pTVar1 + 0xc) == -5) && (L->top <= pTVar1 + 2)) {
    uVar2 = *(int *)((ulong)pTVar1[1].u32.lo + 0xc) + 1;
  }
  else {
    uVar2 = ffi_checkint(L,3);
  }
  memcpy(__dest,__src,(ulong)uVar2);
  return 0;
}

Assistant:

LJLIB_CF(ffi_copy)	LJLIB_REC(.)
{
  void *dp = ffi_checkptr(L, 1, CTID_P_VOID);
  void *sp = ffi_checkptr(L, 2, CTID_P_CVOID);
  TValue *o = L->base+1;
  CTSize len;
  if (tvisstr(o) && o+1 >= L->top)
    len = strV(o)->len+1;  /* Copy Lua string including trailing '\0'. */
  else
    len = (CTSize)ffi_checkint(L, 3);
  memcpy(dp, sp, len);
  return 0;
}